

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

If * __thiscall
wasm::Builder::makeIf
          (Builder *this,Expression *condition,Expression *ifTrue,Expression *ifFalse,
          optional<wasm::Type> type)

{
  If *pIVar1;
  If *ret;
  Expression *ifFalse_local;
  Expression *ifTrue_local;
  Expression *condition_local;
  Builder *this_local;
  optional<wasm::Type> type_local;
  
  pIVar1 = MixedArena::alloc<wasm::If>((MixedArena *)(this->wasm + 0x200));
  pIVar1->condition = condition;
  pIVar1->ifTrue = ifTrue;
  pIVar1->ifFalse = ifFalse;
  wasm::If::finalize(pIVar1,type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::Type>._M_payload,
                     type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Type>._M_engaged);
  return pIVar1;
}

Assistant:

If* makeIf(Expression* condition,
             Expression* ifTrue,
             Expression* ifFalse = nullptr,
             std::optional<Type> type = std::nullopt) {
    auto* ret = wasm.allocator.alloc<If>();
    ret->condition = condition;
    ret->ifTrue = ifTrue;
    ret->ifFalse = ifFalse;
    ret->finalize(type);
    return ret;
  }